

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* args::Wrap(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *in,size_type width,size_type firstlinewidth)

{
  ulong uVar1;
  size_type sVar2;
  long lVar3;
  long lVar4;
  string item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  ostringstream line;
  move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_320;
  istringstream stream;
  byte abStack_190 [352];
  
  uVar1 = std::__cxx11::string::find((char)in,10);
  if (uVar1 == 0xffffffffffffffff) {
    std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)in,_S_in);
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&line);
    if (firstlinewidth == 0) {
      firstlinewidth = width;
    }
    lVar3 = 0;
    while ((abStack_190[*(long *)(_stream + -0x18)] & 5) == 0) {
      item._M_dataplus._M_p = (pointer)&item.field_2;
      item._M_string_length = 0;
      item.field_2._M_local_buf[0] = '\0';
      std::operator>>((istream *)&stream,(string *)&item);
      sVar2 = Glyphs(&item);
      if (lVar3 == 0 || sVar2 + lVar3 + 1 <= firstlinewidth) {
        if (sVar2 != 0) {
          if (lVar3 == 0) {
            lVar4 = 0;
          }
          else {
            std::operator<<((ostream *)&line," ");
            lVar4 = lVar3 + 1;
          }
          goto LAB_0011c8ca;
        }
      }
      else {
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        local_348._M_string_length = 0;
        local_348.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringbuf::str((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_348);
        lVar4 = 0;
        lVar3 = 0;
        firstlinewidth = width;
        if (sVar2 != 0) {
LAB_0011c8ca:
          std::operator<<((ostream *)&line,(string *)&item);
          lVar3 = lVar4 + sVar2;
        }
      }
      std::__cxx11::string::~string((string *)&item);
    }
    if (lVar3 != 0) {
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&item);
      std::__cxx11::string::~string((string *)&item);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&line);
    std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
  }
  else {
    std::__cxx11::string::string((string *)&stream,(string *)in,0,uVar1);
    Wrap(__return_storage_ptr__,(string *)&stream,width,0);
    std::__cxx11::string::~string((string *)&stream);
    std::__cxx11::string::string((string *)&stream,(string *)in,uVar1 + 1,(allocator *)&item);
    Wrap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&line,(string *)&stream,width,0);
    std::__cxx11::string::~string((string *)&stream);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,_line,local_320);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&line);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Wrap(const std::string &in, const std::string::size_type width, std::string::size_type firstlinewidth = 0)
    {
        // Preserve existing line breaks
        const auto newlineloc = in.find('\n');
        if (newlineloc != in.npos)
        {
            auto first = Wrap(std::string(in, 0, newlineloc), width);
            auto second = Wrap(std::string(in, newlineloc + 1), width);
            first.insert(
                std::end(first),
                std::make_move_iterator(std::begin(second)),
                std::make_move_iterator(std::end(second)));
            return first;
        }
        if (firstlinewidth == 0)
        {
            firstlinewidth = width;
        }
        auto currentwidth = firstlinewidth;

        std::istringstream stream(in);
        std::vector<std::string> output;
        std::ostringstream line;
        std::string::size_type linesize = 0;
        while (stream)
        {
            std::string item;
            stream >> item;
            auto itemsize = Glyphs(item);
            if ((linesize + 1 + itemsize) > currentwidth)
            {
                if (linesize > 0)
                {
                    output.push_back(line.str());
                    line.str(std::string());
                    linesize = 0;
                    currentwidth = width;
                }
            }
            if (itemsize > 0)
            {
                if (linesize)
                {
                    ++linesize;
                    line << " ";
                }
                line << item;
                linesize += itemsize;
            }
        }
        if (linesize > 0)
        {
            output.push_back(line.str());
        }
        return output;
    }